

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     VoidFinalize<duckdb::FirstState<duckdb::string_t>,duckdb::FirstVectorFunction<false,true>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  FirstState<duckdb::string_t> *state;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  FirstState<duckdb::string_t> **sdata_1;
  AggregateFinalizeData finalize_data;
  FirstState<duckdb::string_t> **sdata;
  ulong local_70;
  AggregateFinalizeData *in_stack_ffffffffffffffa8;
  FirstState<duckdb::string_t> *in_stack_ffffffffffffffb0;
  VectorType in_stack_ffffffffffffffbf;
  Vector *in_stack_ffffffffffffffc0;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    ConstantVector::GetData<duckdb::FirstState<duckdb::string_t>*>((Vector *)0xf93cc4);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb8,in_RDX,in_RSI);
    FirstVectorFunction<false,true>::Finalize<duckdb::FirstState<duckdb::string_t>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    Vector::SetVectorType(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    state = (FirstState<duckdb::string_t> *)
            FlatVector::GetData<duckdb::FirstState<duckdb::string_t>*>((Vector *)0xf93d07);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffff98,in_RDX,in_RSI);
    for (local_70 = 0; local_70 < in_RCX; local_70 = local_70 + 1) {
      FirstVectorFunction<false,true>::Finalize<duckdb::FirstState<duckdb::string_t>>
                (state,(AggregateFinalizeData *)(local_70 + in_R8));
    }
  }
  return;
}

Assistant:

static void VoidFinalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                         idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<STATE_TYPE>(**sdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<STATE_TYPE>(*sdata[i], finalize_data);
			}
		}
	}